

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(ConfidentialTxInReference *this)

{
  ConfidentialTxInReference *this_local;
  
  (this->super_AbstractTxInReference)._vptr_AbstractTxInReference =
       (_func_int **)&PTR__ConfidentialTxInReference_01b4ff50;
  ScriptWitness::~ScriptWitness(&this->pegin_witness_);
  ByteData::~ByteData(&this->inflation_keys_rangeproof_);
  ByteData::~ByteData(&this->issuance_amount_rangeproof_);
  ConfidentialValue::~ConfidentialValue(&this->inflation_keys_);
  ConfidentialValue::~ConfidentialValue(&this->issuance_amount_);
  ByteData256::~ByteData256(&this->asset_entropy_);
  ByteData256::~ByteData256(&this->blinding_nonce_);
  AbstractTxInReference::~AbstractTxInReference(&this->super_AbstractTxInReference);
  return;
}

Assistant:

virtual ~ConfidentialTxInReference() {
    // do nothing
  }